

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

int __thiscall
cbtAlignedObjectArray<cbtHashString>::copy
          (cbtAlignedObjectArray<cbtHashString> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int in_EAX;
  int extraout_EAX;
  long in_RCX;
  long lVar1;
  long lVar2;
  
  lVar2 = (long)(int)dst;
  lVar1 = lVar2 * 0x28;
  for (; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    cbtHashString::cbtHashString
              ((cbtHashString *)(in_RCX + lVar1),
               (cbtHashString *)((long)&(this->m_data->m_string1)._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + 0x28;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

SIMD_FORCE_INLINE void copy(int start, int end, T* dest) const
	{
		int i;
		for (i = start; i < end; ++i)
#ifdef BT_USE_PLACEMENT_NEW
			new (&dest[i]) T(m_data[i]);
#else
			dest[i] = m_data[i];
#endif  //BT_USE_PLACEMENT_NEW
	}